

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool mkvparser::Colour::Parse
               (IMkvReader *reader,longlong colour_start,longlong colour_size,Colour **colour)

{
  long mm_size;
  bool bVar1;
  Colour *this;
  long lVar2;
  longlong lVar3;
  pointer pCVar4;
  pointer local_88;
  long status;
  longlong child_size;
  longlong child_id;
  longlong read_pos;
  longlong colour_end;
  undefined1 local_41;
  Colour *local_40;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> local_38;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  Colour **colour_local;
  longlong colour_size_local;
  longlong colour_start_local;
  IMkvReader *reader_local;
  
  if ((reader == (IMkvReader *)0x0) || (*colour != (Colour *)0x0)) {
    reader_local._7_1_ = false;
  }
  else {
    colour_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
    super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
         (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
         colour;
    this = (Colour *)operator_new(0x70,(nothrow_t *)&std::nothrow);
    local_41 = 0;
    local_88 = (pointer)0x0;
    if (this != (Colour *)0x0) {
      local_41 = 1;
      local_40 = this;
      Colour(this);
      local_88 = this;
    }
    std::unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>>::
    unique_ptr<std::default_delete<mkvparser::Colour>,void>
              ((unique_ptr<mkvparser::Colour,std::default_delete<mkvparser::Colour>> *)&local_38,
               local_88);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
    if (bVar1) {
      read_pos = colour_start + colour_size;
      child_id = colour_start;
      do {
        if (read_pos <= child_id) {
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   release(&local_38);
          *(pointer *)
           colour_ptr._M_t.
           super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
           super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
           super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl = pCVar4;
          reader_local._7_1_ = true;
          goto LAB_00132ce2;
        }
        child_size = 0;
        status = 0;
        lVar2 = ParseElementHeader(reader,&child_id,read_pos,&child_size,&status);
        lVar3 = child_id;
        mm_size = status;
        if (lVar2 < 0) {
          reader_local._7_1_ = false;
          goto LAB_00132ce2;
        }
        if (child_size == 0x55b1) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->matrix_coefficients = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->matrix_coefficients < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b2) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->bits_per_channel = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->bits_per_channel < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b3) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->chroma_subsampling_horz = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->chroma_subsampling_horz < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b4) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->chroma_subsampling_vert = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->chroma_subsampling_vert < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b5) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->cb_subsampling_horz = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->cb_subsampling_horz < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b6) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->cb_subsampling_vert = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->cb_subsampling_vert < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b7) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->chroma_siting_horz = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->chroma_siting_horz < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b8) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->chroma_siting_vert = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->chroma_siting_vert < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55b9) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->range = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->range < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55ba) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->transfer_characteristics = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->transfer_characteristics < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55bb) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->primaries = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->primaries < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55bc) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->max_cll = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->max_cll < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else if (child_size == 0x55bd) {
          lVar3 = UnserializeUInt(reader,child_id,status);
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          pCVar4->max_fall = lVar3;
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          if (pCVar4->max_fall < 0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        else {
          if (child_size != 0x55d0) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
          pCVar4 = std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::
                   operator->(&local_38);
          bVar1 = MasteringMetadata::Parse(reader,lVar3,mm_size,&pCVar4->mastering_metadata);
          if (!bVar1) {
            reader_local._7_1_ = false;
            goto LAB_00132ce2;
          }
        }
        child_id = status + child_id;
      } while (child_id <= read_pos);
      reader_local._7_1_ = false;
    }
    else {
      reader_local._7_1_ = false;
    }
LAB_00132ce2:
    colour_end._0_4_ = 1;
    std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
              (&local_38);
  }
  return reader_local._7_1_;
}

Assistant:

bool Colour::Parse(IMkvReader* reader, long long colour_start,
                   long long colour_size, Colour** colour) {
  if (!reader || *colour)
    return false;

  std::unique_ptr<Colour> colour_ptr(new (std::nothrow) Colour());
  if (!colour_ptr)
    return false;

  const long long colour_end = colour_start + colour_size;
  long long read_pos = colour_start;

  while (read_pos < colour_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long status =
        ParseElementHeader(reader, read_pos, colour_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvMatrixCoefficients) {
      colour_ptr->matrix_coefficients =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->matrix_coefficients < 0)
        return false;
    } else if (child_id == libwebm::kMkvBitsPerChannel) {
      colour_ptr->bits_per_channel =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->bits_per_channel < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingHorz) {
      colour_ptr->chroma_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingVert) {
      colour_ptr->chroma_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingHorz) {
      colour_ptr->cb_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingVert) {
      colour_ptr->cb_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingHorz) {
      colour_ptr->chroma_siting_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingVert) {
      colour_ptr->chroma_siting_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvRange) {
      colour_ptr->range = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->range < 0)
        return false;
    } else if (child_id == libwebm::kMkvTransferCharacteristics) {
      colour_ptr->transfer_characteristics =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->transfer_characteristics < 0)
        return false;
    } else if (child_id == libwebm::kMkvPrimaries) {
      colour_ptr->primaries = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->primaries < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxCLL) {
      colour_ptr->max_cll = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_cll < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxFALL) {
      colour_ptr->max_fall = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_fall < 0)
        return false;
    } else if (child_id == libwebm::kMkvMasteringMetadata) {
      if (!MasteringMetadata::Parse(reader, read_pos, child_size,
                                    &colour_ptr->mastering_metadata))
        return false;
    } else {
      return false;
    }

    read_pos += child_size;
    if (read_pos > colour_end)
      return false;
  }
  *colour = colour_ptr.release();
  return true;
}